

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MapEntryMessageName_Test::TestBody
          (ValidationErrorTest_MapEntryMessageName_Test *this)

{
  DescriptorProto *pDVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  FieldDescriptorProto *this_00;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  undefined1 local_138 [8];
  FileDescriptorProto file_proto;
  ValidationErrorTest_MapEntryMessageName_Test *this_local;
  
  file_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_138);
  anon_unknown_532::FillValidMapEntry((FileDescriptorProto *)local_138);
  pDVar1 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_138,0);
  pDVar1 = DescriptorProto::mutable_nested_type(pDVar1,0);
  puVar2 = internal::HasBits<1>::operator[](&(pDVar1->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pDVar1);
  internal::ArenaStringPtr::Set(&(pDVar1->field_0)._impl_.name_,"OtherMapEntry",pAVar3);
  pDVar1 = FileDescriptorProto::mutable_message_type((FileDescriptorProto *)local_138,0);
  this_00 = DescriptorProto::mutable_field(pDVar1,0);
  puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.type_name_,"OtherMapEntry",pAVar3);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_160,descriptor_unittest::(anonymous_namespace)::kMapEntryErrorMessage);
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(FileDescriptorProto *)local_138,&local_160);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_160);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_138);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MapEntryMessageName) {
  FileDescriptorProto file_proto;
  FillValidMapEntry(&file_proto);
  file_proto.mutable_message_type(0)->mutable_nested_type(0)->set_name(
      "OtherMapEntry");
  file_proto.mutable_message_type(0)->mutable_field(0)->set_type_name(
      "OtherMapEntry");
  BuildFileWithErrors(file_proto, kMapEntryErrorMessage);
}